

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateSimplifiedInt4Rem(Lowerer *this,Instr *remInstr,LabelInstr *skipBailOutLabel)

{
  undefined2 uVar1;
  Opnd *this_00;
  Opnd *src1;
  IntConstOpnd *this_01;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  bool bVar5;
  OpCode OVar6;
  BailOutKind BVar7;
  uint sourceContextId;
  uint functionId;
  uint uVar8;
  int32 iVar9;
  undefined4 *puVar10;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  LabelInstr *target;
  IntConstOpnd *dst;
  IntConstOpnd *src2;
  LabelInstr *local_40;
  
  if (remInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6768,"(remInstr)","remInstr");
    if (!bVar3) goto LAB_005a5f0f;
    *puVar10 = 0;
  }
  uVar1 = remInstr->m_opcode;
  if (1 < (ushort)(uVar1 - 0x1c5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6769,
                       "(remInstr->m_opcode == Js::OpCode::Rem_I4 || remInstr->m_opcode == Js::OpCode::RemU_I4)"
                       ,
                       "remInstr->m_opcode == Js::OpCode::Rem_I4 || remInstr->m_opcode == Js::OpCode::RemU_I4"
                      );
    if (!bVar3) goto LAB_005a5f0f;
    *puVar10 = 0;
  }
  this_00 = remInstr->m_dst;
  src1 = remInstr->m_src1;
  this_01 = (IntConstOpnd *)remInstr->m_src2;
  if (src1 == (Opnd *)0x0 || this_01 == (IntConstOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x676d,"(src1 && src2)","src1 && src2");
    if (!bVar3) goto LAB_005a5f0f;
    *puVar10 = 0;
  }
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x676e,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar3) goto LAB_005a5f0f;
    *puVar10 = 0;
  }
  if ((remInstr->field_0x38 & 0x10) == 0) {
    bVar3 = false;
  }
  else {
    BVar7 = IR::Instr::GetBailOutKind(remInstr);
    bVar3 = BVar7 == BailOnModByPowerOf2;
  }
  this_02 = JITTimeWorkItem::GetJITFunctionBody(remInstr->m_func->topFunc->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_02);
  this_03 = JITTimeWorkItem::GetJITTimeInfo(remInstr->m_func->topFunc->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
  bVar5 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,MathFastPathPhase,sourceContextId,functionId);
  if ((bVar3 == false) && (bVar5)) {
    return false;
  }
  OVar4 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar4 == OpndKindIntConst) {
    OVar4 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar4 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar5) goto LAB_005a5f0f;
      *puVar10 = 0;
    }
    uVar8 = IR::IntConstOpnd::AsInt32(this_01);
    if (((uVar8 + 0x7fffffff & uVar8) != 0 || (int)uVar8 < 1) && bVar3 == false) {
      return false;
    }
  }
  else if (bVar3 == false) {
    return false;
  }
  local_40 = skipBailOutLabel;
  if (skipBailOutLabel == (LabelInstr *)0x0) {
    local_40 = IR::LabelInstr::New(Label,remInstr->m_func,false);
    IR::Instr::InsertAfter(remInstr,&local_40->super_Instr);
  }
  target = IR::LabelInstr::New(Label,remInstr->m_func,bVar3);
  IR::Instr::InsertBefore(remInstr,&target->super_Instr);
  InsertTest(src1,src1,&target->super_Instr);
  OVar6 = LowererMD::MDCompareWithZeroBranchOpcode(BrLt_A);
  InsertBranch(OVar6,false,target,&target->super_Instr);
  if (bVar3 == false) {
    OVar4 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar4 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x67ad,"(src2->IsIntConstOpnd())","src2->IsIntConstOpnd()");
      if (!bVar3) goto LAB_005a5f0f;
      *puVar10 = 0;
    }
    OVar4 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar4 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar3) {
LAB_005a5f0f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar10 = 0;
    }
    iVar9 = IR::IntConstOpnd::AsInt32(this_01);
    dst = IR::IntConstOpnd::New((long)(iVar9 + -1),TyInt32,remInstr->m_func,false);
  }
  else {
    dst = (IntConstOpnd *)IR::RegOpnd::New(TyInt32,remInstr->m_func);
    InsertMove((Opnd *)dst,(Opnd *)this_01,&target->super_Instr,true);
    src2 = IR::IntConstOpnd::New(1,TyInt32,this->m_func,true);
    InsertSub(true,(Opnd *)dst,(Opnd *)dst,&src2->super_Opnd,&target->super_Instr);
    OVar6 = LowererMD::MDCompareWithZeroBranchOpcode(BrLt_A);
    InsertBranch(OVar6,false,target,&target->super_Instr);
    InsertTest((Opnd *)this_01,(Opnd *)dst,&target->super_Instr);
    InsertBranch(BrNeq_A,false,target,&target->super_Instr);
  }
  InsertAnd(this_00,src1,&dst->super_Opnd,&target->super_Instr);
  InsertBranch(Br,false,local_40,&target->super_Instr);
  return true;
}

Assistant:

bool
Lowerer::GenerateSimplifiedInt4Rem(
    IR::Instr *const remInstr,
    IR::LabelInstr *const skipBailOutLabel) const
{
    Assert(remInstr);
    Assert(remInstr->m_opcode == Js::OpCode::Rem_I4 || remInstr->m_opcode == Js::OpCode::RemU_I4);

    auto *dst = remInstr->GetDst(), *src1 = remInstr->GetSrc1(), *src2 = remInstr->GetSrc2();

    Assert(src1 && src2);
    Assert(dst->IsRegOpnd());

    bool isModByPowerOf2 = (remInstr->HasBailOutInfo() && remInstr->GetBailOutKind() == IR::BailOnModByPowerOf2);

    if (PHASE_OFF(Js::Phase::MathFastPathPhase, remInstr->m_func->GetTopFunc()) && !isModByPowerOf2)
        return false;

    if (!(src2->IsIntConstOpnd() && Math::IsPow2(src2->AsIntConstOpnd()->AsInt32())) && !isModByPowerOf2)
    {
        return false;
    }
    // We have:
    //     s3 = s1 % s2 , where s2 = +2^i
    //
    // Generate:
    //     test s1, s1
    //     js   $slowPathLabel
    //     s3 = and s1, 0x00..fff  (2^i - 1)
    //     jmp  $doneLabel
    //   $slowPathLabel:
    //     (Slow path)
    //     (Neg zero check)
    //     (Bailout code)
    //   $doneLabel:

    IR::LabelInstr *doneLabel = skipBailOutLabel, *slowPathLabel;

    if (!doneLabel)
    {
        doneLabel = IR::LabelInstr::New(Js::OpCode::Label, remInstr->m_func);
        remInstr->InsertAfter(doneLabel);
    }
    slowPathLabel = IR::LabelInstr::New(Js::OpCode::Label, remInstr->m_func, isModByPowerOf2);
    remInstr->InsertBefore(slowPathLabel);

    // test s1, s1
    InsertTest(src1, src1, slowPathLabel);

    // jsb $slowPathLabel
    InsertBranch(LowererMD::MDCompareWithZeroBranchOpcode(Js::OpCode::BrLt_A), slowPathLabel, slowPathLabel);

    // s3 = and s1, 0x00..fff (2^i - 1)
    IR::Opnd* maskOpnd;

    if(isModByPowerOf2)
    {
        Assert(isModByPowerOf2);
        maskOpnd = IR::RegOpnd::New(TyInt32, remInstr->m_func);

        // mov maskOpnd, s2
        InsertMove(maskOpnd, src2, slowPathLabel);

        // dec maskOpnd
        InsertSub(/*needFlags*/ true, maskOpnd, maskOpnd, IR::IntConstOpnd::New(1, TyInt32, this->m_func, /*dontEncode*/true), slowPathLabel);

        // maskOpnd < 0 goto $slowPath
        InsertBranch(LowererMD::MDCompareWithZeroBranchOpcode(Js::OpCode::BrLt_A), slowPathLabel, slowPathLabel);

        // TEST src2, maskOpnd
        InsertTestBranch(src2, maskOpnd, Js::OpCode::BrNeq_A, slowPathLabel, slowPathLabel);
    }
    else
    {
        Assert(src2->IsIntConstOpnd());
        int32 mask =  src2->AsIntConstOpnd()->AsInt32() - 1;
        maskOpnd = IR::IntConstOpnd::New(mask, TyInt32, remInstr->m_func);
    }

    // dst = src1 & maskOpnd
    InsertAnd(dst, src1, maskOpnd, slowPathLabel);

    // jmp $doneLabel
    InsertBranch(Js::OpCode::Br, doneLabel, slowPathLabel);
    return true;
}